

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::EOR_ZP_X(CPU *this)

{
  uint8_t uVar1;
  byte bVar2;
  uint8_t data;
  CPU *this_local;
  
  this->cycles = 4;
  uVar1 = GetByte(this);
  this->cycles = this->cycles - 1;
  bVar2 = ReadByte(this,(ushort)(byte)(uVar1 + this->X));
  this->A = this->A ^ bVar2;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (this->A == '\0') << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((this->A & 0x80) != 0 && -1 < (int)(this->A & 0x80)) << 7;
  return;
}

Assistant:

void CPU::EOR_ZP_X()
{
    cycles = 4;
    uint8_t data = GetByte();
    data += X;
    cycles--;
    A ^= ReadByte(data);
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}